

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

void __thiscall
pbrt::BinaryWriter::write<std::__cxx11::string,pbrt::Texture>
          (BinaryWriter *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
          *values)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  int32_t size;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>
  it;
  undefined4 local_7c;
  shared_ptr<pbrt::Texture> local_78;
  undefined4 local_64;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>
  local_60;
  
  local_64 = (undefined4)(values->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  writeRaw(this,&local_64,4);
  p_Var1 = (values->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(values->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>
      ::pair(&local_60,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>
              *)(p_Var1 + 1));
      local_7c = (undefined4)local_60.first._M_string_length;
      writeRaw(this,&local_7c,4);
      writeRaw(this,local_60.first._M_dataplus._M_p,
               CONCAT44(local_60.first._M_string_length._4_4_,
                        (undefined4)local_60.first._M_string_length));
      local_78.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_60.second.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_78.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_60.second.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
      if (local_60.second.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_60.second.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi)->_M_use_count =
               (local_60.second.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_60.second.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi)->_M_use_count =
               (local_60.second.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      write<pbrt::Texture>(this,&local_78);
      if (local_78.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_60.second.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.second.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.first._M_dataplus._M_p != &local_60.first.field_2) {
        operator_delete(local_60.first._M_dataplus._M_p);
      }
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return;
}

Assistant:

void write(const std::map<T1,std::shared_ptr<T2>> &values)
    {
      int32_t size = (int32_t)values.size();
      write(size);
      for (auto it : values) {
        write(it.first);
        write(it.second);
        // write(serialize(it.second));
      }
    }